

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

char * lws_get_urlarg_by_name(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  size_t sVar2;
  int local_30;
  int sl;
  int n;
  int len_local;
  char *buf_local;
  char *name_local;
  lws *wsi_local;
  
  local_30 = 0;
  sVar2 = strlen(name);
  while( true ) {
    iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,local_30);
    if (iVar1 < 0) {
      return (char *)0x0;
    }
    iVar1 = strncmp(buf,name,(long)(int)sVar2);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  return buf + (int)sVar2;
}

Assistant:

const char *
lws_get_urlarg_by_name(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, sl = (int)strlen(name);

	while (lws_hdr_copy_fragment(wsi, buf, len,
			  WSI_TOKEN_HTTP_URI_ARGS, n) >= 0) {

		if (!strncmp(buf, name, sl))
			return buf + sl;

		n++;
	}

	return NULL;
}